

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

void VP8PutSignedBits(VP8BitWriter *bw,int value,int nb_bits)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  int in_stack_ffffffffffffffe8;
  uint32_t in_stack_ffffffffffffffec;
  
  iVar1 = VP8PutBitUniform((VP8BitWriter *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  if (iVar1 != 0) {
    if (in_ESI < 0) {
      VP8PutBits((VP8BitWriter *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                 in_stack_ffffffffffffffe8);
    }
    else {
      VP8PutBits((VP8BitWriter *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                 in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

void VP8PutSignedBits(VP8BitWriter* const bw, int value, int nb_bits) {
  if (!VP8PutBitUniform(bw, value != 0)) return;
  if (value < 0) {
    VP8PutBits(bw, ((-value) << 1) | 1, nb_bits + 1);
  } else {
    VP8PutBits(bw, value << 1, nb_bits + 1);
  }
}